

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QList<QVariant> *c)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  QDebug *pQVar4;
  QVariant *variant;
  QVariant *pQVar5;
  QVariant *pQVar6;
  long in_FS_OFFSET;
  QDebug QStack_48;
  QDebug local_40;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(((debug.stream)->ts)._vptr_QTextStream + 6) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  pQVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar5 = pQVar6 + lVar2;
  if (lVar2 == 0) goto LAB_0028474a;
  ::operator<<(&local_40,(QVariant *)debug.stream);
  pQVar4 = &local_40;
  while( true ) {
    QDebug::~QDebug(pQVar4);
    pQVar6 = pQVar6 + 1;
LAB_0028474a:
    if (pQVar6 == pQVar5) break;
    variant = (QVariant *)QDebug::operator<<((QDebug *)debug.stream,", ");
    ::operator<<(&QStack_48,variant);
    pQVar4 = &QStack_48;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  pp_Var3 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}